

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O3

void __thiscall
mp::internal::TextReader<fmt::Locale>::TextReader
          (TextReader<fmt::Locale> *this,NLStringRef data,CStringRef name)

{
  char *pcVar1;
  allocator<char> local_11;
  
  pcVar1 = data.data_;
  (this->super_ReaderBase).ptr_ = pcVar1;
  (this->super_ReaderBase).start_ = pcVar1;
  (this->super_ReaderBase).end_ = pcVar1 + data.size_;
  (this->super_ReaderBase).token_ = pcVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&(this->super_ReaderBase).name_,name.data_,&local_11);
  this->line_start_ = (this->super_ReaderBase).ptr_;
  this->line_ = 1;
  CopyableLocale::CopyableLocale(&this->locale_);
  return;
}

Assistant:

mp::internal::TextReader<Locale>::TextReader(
    NLStringRef data, fmt::CStringRef name)
: ReaderBase(data, name), line_start_(ptr_), line_(1) {}